

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-inequalities-101.cpp
# Opt level: O1

rc_size __thiscall
baryonyx::itm::
solver_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>
::compute_reduced_costs<baryonyx::bit_array>
          (solver_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>
           *this,row_iterator begin,row_iterator end,bit_array *x)

{
  uint uVar1;
  rc_data *prVar2;
  ulong uVar3;
  rc_size rVar4;
  uint uVar5;
  ulong uVar6;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble lVar7;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble lVar8;
  longdouble in_ST5;
  tuple<baryonyx::sparse_matrix<int>::col_value_*,_baryonyx::sparse_matrix<int>::col_value_*> ht;
  __uniq_ptr_impl<int,_std::default_delete<int[]>_> local_58;
  _Head_base<0UL,_int_*,_false> local_50;
  longdouble local_48;
  longdouble local_3c;
  
  rVar4.r_size = 0;
  rVar4.c_size = 0;
  if (begin != end) {
    uVar6 = 0;
    do {
      sparse_matrix<int>::column((sparse_matrix<int> *)&local_58,(int)this + 0x10);
      local_48 = (longdouble)0;
      local_3c = local_48;
      lVar8 = in_ST4;
      in_ST4 = in_ST5;
      if ((tuple<int_*,_std::default_delete<int[]>_>)local_50._M_head_impl !=
          (_Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>)
          local_58._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
          super__Head_base<0UL,_int_*,_false>._M_head_impl) {
        local_3c = (longdouble)0;
        local_48 = local_3c;
        do {
          uVar1 = *local_50._M_head_impl;
          uVar5 = uVar1 + 0x3f;
          if (-1 < (int)uVar1) {
            uVar5 = uVar1;
          }
          local_48 = (this->pi)._M_t.
                     super___uniq_ptr_impl<long_double,_std::default_delete<long_double[]>_>._M_t.
                     super__Tuple_impl<0UL,_long_double_*,_std::default_delete<long_double[]>_>.
                     super__Head_base<0UL,_long_double_*,_false>._M_head_impl
                     [*(local_50._M_head_impl + 4)] *
                     (longdouble)
                     value_bit_array<-1,_1>::return_value
                     [(uint)((this->A).super_bit_array_impl.m_data._M_t.
                             super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                             .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl
                             [(int)uVar5 >> 6] >> ((ulong)uVar1 & 0x3f)) & 1] + local_48;
          local_3c = (this->P)._M_t.
                     super___uniq_ptr_impl<long_double,_std::default_delete<long_double[]>_>._M_t.
                     super__Tuple_impl<0UL,_long_double_*,_std::default_delete<long_double[]>_>.
                     super__Head_base<0UL,_long_double_*,_false>._M_head_impl[(int)uVar1] *
                     (longdouble)
                     value_bit_array<-1,_1>::return_value
                     [(uint)((this->A).super_bit_array_impl.m_data._M_t.
                             super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                             .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl
                             [(int)uVar5 >> 6] >> ((ulong)uVar1 & 0x3f)) & 1] + local_3c;
          local_50._M_head_impl = local_50._M_head_impl + 8;
          lVar8 = in_ST3;
          in_ST4 = in_ST3;
        } while ((tuple<int_*,_std::default_delete<int[]>_>)local_50._M_head_impl !=
                 (_Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>)
                 local_58._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                 super__Head_base<0UL,_int_*,_false>._M_head_impl);
      }
      (this->R)._M_t.
      super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::rc_data,_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::rc_data[]>_>
      ._M_t.
      super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::rc_data[]>_>
      .
      super__Head_base<0UL,_baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::rc_data_*,_false>
      ._M_head_impl[uVar6].id = (int)uVar6;
      in_ST5 = in_ST4;
      quadratic_cost_type<long_double>::operator()
                ((longdouble *)this->c,
                 (quadratic_cost_type<long_double> *)(ulong)(uint)begin->column,(int)x,
                 (bit_array *)
                 local_58._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                 super__Head_base<0UL,_int_*,_false>._M_head_impl);
      lVar7 = (in_ST0 - local_48) - local_3c;
      prVar2 = (this->R)._M_t.
               super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::rc_data,_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::rc_data[]>_>
               ._M_t.
               super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::rc_data[]>_>
               .
               super__Head_base<0UL,_baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::rc_data_*,_false>
               ._M_head_impl;
      prVar2[uVar6].value = lVar7;
      uVar1 = begin->value;
      uVar5 = uVar1 + 0x3f;
      if (-1 < (int)uVar1) {
        uVar5 = uVar1;
      }
      uVar3 = (this->A).super_bit_array_impl.m_data._M_t.
              super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
              super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
              super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl[(int)uVar5 >> 6];
      prVar2[uVar6].f =
           value_bit_array<-1,_1>::return_value[(uint)(uVar3 >> ((ulong)uVar1 & 0x3f)) & 1];
      if ((uVar3 >> ((ulong)uVar1 & 0x3f) & 1) == 0) {
        prVar2[uVar6].value = -lVar7;
        rVar4.r_size = rVar4.r_size + 1;
        rVar4.c_size = 0;
      }
      uVar6 = uVar6 + 1;
      begin = begin + 1;
      in_ST0 = in_ST1;
      in_ST1 = in_ST2;
      in_ST2 = in_ST3;
      in_ST3 = lVar8;
    } while (begin != end);
    rVar4 = (rc_size)((long)rVar4 << 0x20 | uVar6 & 0xffffffff);
  }
  return rVar4;
}

Assistant:

rc_size compute_reduced_costs(sparse_matrix<int>::row_iterator begin,
                                  sparse_matrix<int>::row_iterator end,
                                  const Xtype& x) noexcept
    {
        int r_size = 0;
        int c_size = 0;

        for (; begin != end; ++begin) {
            Float sum_a_pi = 0;
            Float sum_a_p = 0;

            auto ht = ap.column(begin->column);

            for (; std::get<0>(ht) != std::get<1>(ht); ++std::get<0>(ht)) {
                auto a = static_cast<Float>(A.get(std::get<0>(ht)->value));

                sum_a_pi += a * pi[std::get<0>(ht)->row];
                sum_a_p += a * P[std::get<0>(ht)->value];
            }

            R[r_size].id = r_size;
            R[r_size].value = c(begin->column, x) - sum_a_pi - sum_a_p;
            R[r_size].f = A.get(begin->value);

            if (R[r_size].is_negative_factor()) {
                R[r_size].value = -R[r_size].value;
                ++c_size;
            }

            ++r_size;
        }

        return { r_size, c_size };
    }